

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concat_x86.cpp
# Opt level: O2

int __thiscall
ncnn::Concat_x86::forward
          (Concat_x86 *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  pointer pMVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  uint _c;
  undefined4 uVar5;
  Mat *pMVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  byte bVar12;
  long lVar13;
  ulong uVar14;
  size_t *psVar15;
  int *piVar16;
  void *pvVar17;
  long lVar18;
  int i;
  ulong uVar19;
  ulong uVar20;
  int iVar21;
  size_t b_2;
  uint uVar22;
  void *pvVar23;
  long lVar24;
  void *pvVar25;
  ulong uVar26;
  undefined4 *puVar27;
  int iVar28;
  long lVar29;
  int iVar30;
  int iVar31;
  pointer pMVar32;
  size_t sVar33;
  long lVar34;
  uint uVar35;
  size_t b_1;
  ulong uVar36;
  void *pvVar37;
  size_t b;
  ulong uVar38;
  ulong uVar39;
  bool bVar40;
  Mat local_80;
  uint local_34;
  
  pMVar32 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  uVar2 = pMVar32->dims;
  iVar3 = (this->super_Concat).axis;
  if (uVar2 == 1) {
    lVar13 = ((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                    _M_impl.super__Vector_impl_data._M_finish - (long)pMVar32) / 0x48;
    piVar16 = &pMVar32->w;
    uVar22 = 0;
    while (bVar40 = lVar13 != 0, lVar13 = lVar13 + -1, bVar40) {
      uVar22 = uVar22 + piVar16[-5] * *piVar16;
      piVar16 = piVar16 + 0x12;
    }
    bVar12 = (uVar22 & 3) == 0 & opt->use_packing_layout;
    iVar28 = (uint)bVar12 + (uint)bVar12 * 2 + 1;
    pMVar6 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    Mat::create(pMVar6,(int)uVar22 / iVar28,
                pMVar32->elemsize / (ulong)(long)pMVar32->elempack << bVar12 * '\x02',iVar28,
                opt->blob_allocator);
    pvVar37 = pMVar6->data;
    if (pvVar37 == (void *)0x0) {
      return -100;
    }
    if ((long)pMVar6->c * pMVar6->cstep == 0) {
      return -100;
    }
    lVar13 = 0x2c;
    for (uVar38 = 0;
        pMVar32 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start,
        uVar38 < (ulong)(((long)(bottom_blobs->
                                super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                                super__Vector_impl_data._M_finish - (long)pMVar32) / 0x48);
        uVar38 = uVar38 + 1) {
      memcpy(pvVar37,*(void **)((long)pMVar32 + lVar13 + -0x2c),
             (long)*(int *)((long)&pMVar32->data + lVar13) *
             *(long *)((long)pMVar32 + lVar13 + -0x1c));
      pvVar37 = (void *)((long)pvVar37 +
                        (long)*(int *)((long)pMVar32 + lVar13 + -0x14) *
                        (long)*(int *)((long)&pMVar32->data + lVar13) * 4);
      lVar13 = lVar13 + 0x48;
    }
  }
  uVar22 = (iVar3 >> 0x1f & uVar2) + iVar3;
  if ((uVar2 == 2) && (uVar22 == 0)) {
    iVar3 = pMVar32->w;
    sVar33 = pMVar32->elemsize;
    iVar28 = pMVar32->elempack;
    lVar13 = ((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                    _M_impl.super__Vector_impl_data._M_finish - (long)pMVar32) / 0x48;
    piVar16 = &pMVar32->h;
    uVar35 = 0;
    while (bVar40 = lVar13 != 0, lVar13 = lVar13 + -1, bVar40) {
      if (*(ulong *)(piVar16 + -8) < sVar33) {
        sVar33 = *(ulong *)(piVar16 + -8);
      }
      iVar21 = piVar16[-6];
      if (iVar21 < iVar28) {
        iVar28 = iVar21;
      }
      uVar35 = uVar35 + iVar21 * *piVar16;
      piVar16 = piVar16 + 0x12;
    }
    bVar12 = (uVar35 & 3) == 0 & opt->use_packing_layout;
    iVar21 = (uint)bVar12 + (uint)bVar12 * 2 + 1;
    pMVar6 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    Mat::create(pMVar6,iVar3,(int)uVar35 / iVar21,sVar33 / (ulong)(long)iVar28 << bVar12 * '\x02',
                iVar21,opt->blob_allocator);
    local_80.data = pMVar6->data;
    if (local_80.data == (void *)0x0) {
      return -100;
    }
    local_80.cstep = pMVar6->cstep;
    local_80.c = pMVar6->c;
    if (local_80.cstep * (long)local_80.c == 0) {
      return -100;
    }
    local_80.refcount = pMVar6->refcount;
    local_80.elemsize = pMVar6->elemsize;
    local_80.elempack = pMVar6->elempack;
    local_80.allocator = pMVar6->allocator;
    uVar8 = pMVar6->dims;
    uVar9 = pMVar6->w;
    uVar10 = pMVar6->h;
    uVar11 = pMVar6->d;
    if (local_80.refcount != (int *)0x0) {
      LOCK();
      *local_80.refcount = *local_80.refcount + 1;
      UNLOCK();
    }
    local_80.dims = uVar8;
    local_80.w = uVar9;
    local_80.h = uVar10;
    local_80.d = uVar11;
    if ((iVar21 <= iVar28) ||
       ((Mat::create(&local_80,iVar3,(int)uVar35 / iVar28,sVar33,iVar28,opt->workspace_allocator),
        local_80.data != (void *)0x0 && ((long)local_80.c * local_80.cstep != 0)))) {
      iVar31 = 0;
      if (0 < iVar3) {
        iVar31 = iVar3;
      }
      lVar13 = (long)(iVar3 * 4) * 4;
      pvVar37 = local_80.data;
      for (uVar38 = 0;
          pMVar32 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                    _M_impl.super__Vector_impl_data._M_start,
          uVar38 < (ulong)(((long)(bottom_blobs->
                                  super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                                  .super__Vector_impl_data._M_finish - (long)pMVar32) / 0x48);
          uVar38 = uVar38 + 1) {
        pMVar1 = pMVar32 + uVar38;
        iVar30 = pMVar32[uVar38].elempack;
        if ((iVar30 == 4) && (iVar28 == 1)) {
          uVar14 = (ulong)(uint)pMVar1->h;
          if (pMVar1->h < 1) {
            uVar14 = 0;
          }
          pvVar17 = (void *)((long)(iVar3 * 3) * 4 + (long)pvVar37);
          pvVar23 = (void *)((long)(iVar3 * 2) * 4 + (long)pvVar37);
          pvVar25 = (void *)((long)iVar3 * 4 + (long)pvVar37);
          for (uVar26 = 0; uVar26 != uVar14; uVar26 = uVar26 + 1) {
            puVar27 = (undefined4 *)
                      ((long)pMVar1->w * uVar26 * pMVar1->elemsize + (long)pMVar1->data);
            for (lVar29 = 0; iVar31 != (int)lVar29; lVar29 = lVar29 + 1) {
              *(undefined4 *)((long)pvVar37 + lVar29 * 4) = *puVar27;
              *(undefined4 *)((long)pvVar25 + lVar29 * 4) = puVar27[1];
              *(undefined4 *)((long)pvVar23 + lVar29 * 4) = puVar27[2];
              *(undefined4 *)((long)pvVar17 + lVar29 * 4) = puVar27[3];
              puVar27 = puVar27 + 4;
            }
            pvVar37 = (void *)((long)pvVar37 + lVar13);
            pvVar17 = (void *)((long)pvVar17 + lVar13);
            pvVar23 = (void *)((long)pvVar23 + lVar13);
            pvVar25 = (void *)((long)pvVar25 + lVar13);
          }
        }
        if (iVar30 == iVar28) {
          lVar29 = (long)pMVar1->h * (long)iVar3;
          memcpy(pvVar37,pMVar1->data,pMVar1->elemsize * lVar29);
          pvVar37 = (void *)((long)pvVar37 + (long)(int)lVar29 * (long)pMVar1->elempack * 4);
        }
      }
      if (iVar28 < iVar21) {
        convert_packing(&local_80,pMVar6,iVar21,opt);
      }
      if (local_80.refcount != (int *)0x0) {
        LOCK();
        *local_80.refcount = *local_80.refcount + -1;
        UNLOCK();
        if (*local_80.refcount == 0) {
          if (local_80.allocator == (Allocator *)0x0) {
            free(local_80.data);
          }
          else {
            (*(local_80.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      goto LAB_00141949;
    }
    if (local_80.refcount == (int *)0x0) {
      return -100;
    }
    LOCK();
    *local_80.refcount = *local_80.refcount + -1;
    UNLOCK();
    if (*local_80.refcount != 0) {
      return -100;
    }
    if (local_80.allocator != (Allocator *)0x0) {
      (*(local_80.allocator)->_vptr_Allocator[3])();
      return -100;
    }
LAB_00142307:
    free(local_80.data);
  }
  else {
LAB_00141949:
    if ((uVar2 == 2) && (uVar22 == 1)) {
      pMVar32 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      uVar35 = pMVar32->h;
      sVar33 = pMVar32->elemsize;
      iVar3 = pMVar32->elempack;
      lVar13 = ((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                      _M_impl.super__Vector_impl_data._M_finish - (long)pMVar32) / 0x48;
      piVar16 = &pMVar32->w;
      iVar28 = 0;
      while (bVar40 = lVar13 != 0, lVar13 = lVar13 + -1, bVar40) {
        iVar28 = iVar28 + *piVar16;
        piVar16 = piVar16 + 0x12;
      }
      pMVar6 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      Mat::create(pMVar6,iVar28,uVar35,sVar33,iVar3,opt->blob_allocator);
      if (pMVar6->data == (void *)0x0) {
        return -100;
      }
      if ((long)pMVar6->c * pMVar6->cstep == 0) {
        return -100;
      }
      uVar14 = 0;
      uVar38 = (ulong)uVar35;
      if ((int)uVar35 < 1) {
        uVar38 = uVar14;
      }
      for (; uVar14 != uVar38; uVar14 = uVar14 + 1) {
        pvVar37 = (void *)((long)pMVar6->w * uVar14 * pMVar6->elemsize + (long)pMVar6->data);
        lVar13 = 0x2c;
        for (uVar26 = 0;
            pMVar32 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                      _M_impl.super__Vector_impl_data._M_start,
            uVar26 < (ulong)(((long)(bottom_blobs->
                                    super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                    _M_impl.super__Vector_impl_data._M_finish - (long)pMVar32) /
                            0x48); uVar26 = uVar26 + 1) {
          lVar29 = (long)*(int *)((long)&pMVar32->data + lVar13);
          memcpy(pvVar37,(void *)(uVar14 * lVar29 * *(long *)((long)pMVar32 + lVar13 + -0x1c) +
                                 *(long *)((long)pMVar32 + lVar13 + -0x2c)),lVar29 * sVar33);
          pvVar37 = (void *)((long)pvVar37 +
                            (long)*(int *)((long)&pMVar32->data + lVar13) * (long)iVar3 * 4);
          lVar13 = lVar13 + 0x48;
        }
      }
    }
    if ((uVar2 - 3 < 2) && (uVar22 == 0)) {
      pMVar32 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      iVar3 = pMVar32->w;
      iVar28 = pMVar32->h;
      iVar21 = pMVar32->d;
      psVar15 = &pMVar32->elemsize;
      sVar33 = pMVar32->elemsize;
      iVar31 = pMVar32->elempack;
      lVar13 = ((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                      _M_impl.super__Vector_impl_data._M_finish - (long)pMVar32) / 0x48;
      uVar35 = 0;
      while (bVar40 = lVar13 != 0, lVar13 = lVar13 + -1, bVar40) {
        if (*psVar15 < sVar33) {
          sVar33 = *psVar15;
        }
        iVar30 = *(int *)(psVar15 + 1);
        if (iVar30 < iVar31) {
          iVar31 = iVar30;
        }
        uVar35 = uVar35 + iVar30 * *(int *)(psVar15 + 5);
        psVar15 = psVar15 + 9;
      }
      bVar12 = (uVar35 & 3) == 0 & opt->use_packing_layout;
      iVar30 = (uint)bVar12 + (uint)bVar12 * 2 + 1;
      pMVar6 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      Mat::create(pMVar6,iVar3,iVar28,iVar21,(int)uVar35 / iVar30,
                  sVar33 / (ulong)(long)iVar31 << bVar12 * '\x02',iVar30,opt->blob_allocator);
      local_80.data = pMVar6->data;
      if (local_80.data == (void *)0x0) {
        return -100;
      }
      local_80.cstep = pMVar6->cstep;
      local_80.c = pMVar6->c;
      if (local_80.cstep * (long)local_80.c == 0) {
        return -100;
      }
      pMVar6->dims = uVar2;
      local_80.refcount = pMVar6->refcount;
      local_80.elemsize = pMVar6->elemsize;
      local_80.elempack = pMVar6->elempack;
      local_80.allocator = pMVar6->allocator;
      uVar5 = pMVar6->w;
      uVar7 = pMVar6->h;
      local_80.d = pMVar6->d;
      if (local_80.refcount != (int *)0x0) {
        LOCK();
        *local_80.refcount = *local_80.refcount + 1;
        UNLOCK();
      }
      local_80.w = uVar5;
      local_80.h = uVar7;
      if ((iVar31 < iVar30) &&
         ((local_80.dims = uVar2,
          Mat::create(&local_80,iVar3,iVar28,iVar21,(int)uVar35 / iVar31,sVar33,iVar31,
                      opt->workspace_allocator), local_80.data == (void *)0x0 ||
          ((long)local_80.c * local_80.cstep == 0)))) {
        if (local_80.refcount == (int *)0x0) {
          return -100;
        }
        LOCK();
        *local_80.refcount = *local_80.refcount + -1;
        UNLOCK();
        if (*local_80.refcount != 0) {
          return -100;
        }
        if (local_80.allocator != (Allocator *)0x0) {
          (*(local_80.allocator)->_vptr_Allocator[3])();
          return -100;
        }
        goto LAB_00142307;
      }
      uVar14 = 0;
      local_80.dims = uVar2;
      for (uVar38 = 0;
          pMVar32 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                    _M_impl.super__Vector_impl_data._M_start,
          uVar38 < (ulong)(((long)(bottom_blobs->
                                  super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                                  .super__Vector_impl_data._M_finish - (long)pMVar32) / 0x48);
          uVar38 = uVar38 + 1) {
        pMVar1 = pMVar32 + uVar38;
        iVar3 = pMVar32[uVar38].elempack;
        if ((iVar3 == 4) && (iVar31 == 1)) {
          iVar28 = pMVar1->h * pMVar1->w * pMVar1->d;
          lVar13 = local_80.cstep * local_80.elemsize;
          if (iVar28 < 1) {
            iVar28 = 0;
          }
          uVar14 = (ulong)(int)uVar14;
          uVar35 = pMVar1->c;
          if (pMVar1->c < 1) {
            uVar35 = 0;
          }
          lVar29 = lVar13 * 4;
          pvVar25 = (void *)(lVar13 * uVar14 + (long)local_80.data);
          pvVar37 = (void *)((uVar14 + 1) * lVar13 + (long)local_80.data);
          pvVar17 = (void *)((uVar14 + 2) * lVar13 + (long)local_80.data);
          pvVar23 = (void *)((uVar14 + 3) * lVar13 + (long)local_80.data);
          for (uVar26 = 0; uVar26 != uVar35; uVar26 = uVar26 + 1) {
            puVar27 = (undefined4 *)(pMVar1->cstep * uVar26 * pMVar1->elemsize + (long)pMVar1->data)
            ;
            for (lVar13 = 0; iVar28 != (int)lVar13; lVar13 = lVar13 + 1) {
              *(undefined4 *)((long)pvVar25 + lVar13 * 4) = *puVar27;
              *(undefined4 *)((long)pvVar37 + lVar13 * 4) = puVar27[1];
              *(undefined4 *)((long)pvVar17 + lVar13 * 4) = puVar27[2];
              *(undefined4 *)((long)pvVar23 + lVar13 * 4) = puVar27[3];
              puVar27 = puVar27 + 4;
            }
            uVar14 = uVar14 + 4;
            pvVar25 = (void *)((long)pvVar25 + lVar29);
            pvVar37 = (void *)((long)pvVar37 + lVar29);
            pvVar17 = (void *)((long)pvVar17 + lVar29);
            pvVar23 = (void *)((long)pvVar23 + lVar29);
          }
        }
        if (iVar3 == iVar31) {
          memcpy((void *)(local_80.cstep * (long)(int)uVar14 * local_80.elemsize +
                         (long)local_80.data),pMVar1->data,
                 (long)((int)pMVar1->cstep * pMVar1->c) * pMVar1->elemsize);
          uVar14 = (ulong)(uint)((int)uVar14 + pMVar1->c);
        }
      }
      if (iVar31 < iVar30) {
        convert_packing(&local_80,pMVar6,iVar30,opt);
      }
      if (local_80.refcount != (int *)0x0) {
        LOCK();
        *local_80.refcount = *local_80.refcount + -1;
        UNLOCK();
        if (*local_80.refcount == 0) {
          if (local_80.allocator == (Allocator *)0x0) {
            free(local_80.data);
          }
          else {
            (*(local_80.allocator)->_vptr_Allocator[3])();
          }
        }
      }
    }
    local_34 = uVar22 ^ 2;
    if ((uVar22 == 1 && uVar2 == 3) || (uVar2 == 4 && local_34 == 0)) {
      pMVar32 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      uVar35 = pMVar32->d;
      uVar4 = pMVar32->c;
      sVar33 = pMVar32->elemsize;
      iVar3 = pMVar32->elempack;
      lVar13 = ((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                      _M_impl.super__Vector_impl_data._M_finish - (long)pMVar32) / 0x48;
      piVar16 = &pMVar32->h;
      iVar28 = 0;
      while (bVar40 = lVar13 != 0, lVar13 = lVar13 + -1, bVar40) {
        iVar28 = iVar28 + *piVar16;
        piVar16 = piVar16 + 0x12;
      }
      pMVar6 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      Mat::create(pMVar6,pMVar32->w,iVar28,uVar35,uVar4,sVar33,iVar3,opt->blob_allocator);
      if (pMVar6->data == (void *)0x0) {
        return -100;
      }
      if ((long)pMVar6->c * pMVar6->cstep == 0) {
        return -100;
      }
      pMVar6->dims = uVar2;
      uVar14 = 0;
      uVar38 = (ulong)uVar35;
      if ((int)uVar35 < 1) {
        uVar38 = uVar14;
      }
      uVar26 = (ulong)uVar4;
      if ((int)uVar4 < 1) {
        uVar26 = uVar14;
      }
      for (; uVar14 != uVar26; uVar14 = uVar14 + 1) {
        pvVar37 = (void *)(pMVar6->cstep * uVar14 * pMVar6->elemsize + (long)pMVar6->data);
        for (uVar19 = 0; uVar19 != uVar38; uVar19 = uVar19 + 1) {
          lVar13 = 0x40;
          for (uVar20 = 0;
              pMVar32 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                        _M_impl.super__Vector_impl_data._M_start,
              uVar20 < (ulong)(((long)(bottom_blobs->
                                      super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                      _M_impl.super__Vector_impl_data._M_finish - (long)pMVar32) /
                              0x48); uVar20 = uVar20 + 1) {
            lVar18 = (long)*(int *)((long)pMVar32 + lVar13 + -0x14);
            lVar24 = (long)*(int *)((long)pMVar32 + lVar13 + -0x10);
            lVar29 = *(long *)((long)pMVar32 + lVar13 + -0x30);
            lVar34 = lVar24 * lVar18;
            memcpy(pvVar37,(void *)(lVar29 * lVar24 * uVar19 * lVar18 +
                                   *(long *)((long)&pMVar32->data + lVar13) * uVar14 * lVar29 +
                                   *(long *)((long)pMVar32 + lVar13 + -0x40)),lVar34 * sVar33);
            pvVar37 = (void *)((long)pvVar37 + (long)((int)lVar34 * iVar3) * 4);
            lVar13 = lVar13 + 0x48;
          }
        }
      }
    }
    if ((uVar2 == 3 && local_34 == 0) || (uVar2 == 4 && uVar22 == 3)) {
      pMVar32 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      uVar35 = pMVar32->h;
      uVar4 = pMVar32->d;
      _c = pMVar32->c;
      sVar33 = pMVar32->elemsize;
      iVar3 = pMVar32->elempack;
      lVar13 = ((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                      _M_impl.super__Vector_impl_data._M_finish - (long)pMVar32) / 0x48;
      piVar16 = &pMVar32->w;
      iVar28 = 0;
      while (bVar40 = lVar13 != 0, lVar13 = lVar13 + -1, bVar40) {
        iVar28 = iVar28 + *piVar16;
        piVar16 = piVar16 + 0x12;
      }
      pMVar6 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      Mat::create(pMVar6,iVar28,uVar35,uVar4,_c,sVar33,iVar3,opt->blob_allocator);
      if (pMVar6->data == (void *)0x0) {
        return -100;
      }
      if ((long)pMVar6->c * pMVar6->cstep == 0) {
        return -100;
      }
      uVar14 = 0;
      uVar38 = (ulong)uVar35;
      if ((int)uVar35 < 1) {
        uVar38 = uVar14;
      }
      pMVar6->dims = uVar2;
      uVar26 = (ulong)uVar4;
      if ((int)uVar4 < 1) {
        uVar26 = uVar14;
      }
      uVar19 = (ulong)_c;
      if ((int)_c < 1) {
        uVar19 = uVar14;
      }
      for (; uVar14 != uVar19; uVar14 = uVar14 + 1) {
        pvVar37 = (void *)(pMVar6->cstep * uVar14 * pMVar6->elemsize + (long)pMVar6->data);
        for (uVar20 = 0; uVar20 != uVar26; uVar20 = uVar20 + 1) {
          for (uVar36 = 0; uVar36 != uVar38; uVar36 = uVar36 + 1) {
            lVar13 = 0x40;
            for (uVar39 = 0;
                pMVar32 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                          _M_impl.super__Vector_impl_data._M_start,
                uVar39 < (ulong)(((long)(bottom_blobs->
                                        super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                        _M_impl.super__Vector_impl_data._M_finish - (long)pMVar32) /
                                0x48); uVar39 = uVar39 + 1) {
              lVar18 = (long)*(int *)((long)pMVar32 + lVar13 + -0x14);
              lVar29 = *(long *)((long)pMVar32 + lVar13 + -0x30);
              lVar24 = lVar29 * lVar18;
              memcpy(pvVar37,(void *)(lVar24 * uVar36 +
                                      (long)*(int *)((long)pMVar32 + lVar13 + -0x10) * uVar20 *
                                      lVar24 + *(long *)((long)&pMVar32->data + lVar13) * uVar14 *
                                               lVar29 + *(long *)((long)pMVar32 + lVar13 + -0x40)),
                     lVar18 * sVar33);
              pvVar37 = (void *)((long)pvVar37 +
                                (long)*(int *)((long)pMVar32 + lVar13 + -0x14) * (long)iVar3 * 4);
              lVar13 = lVar13 + 0x48;
            }
          }
        }
      }
    }
    if (uVar2 != 4) {
      return 0;
    }
    if (uVar22 != 1) {
      return 0;
    }
    pMVar32 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
    uVar2 = pMVar32->c;
    sVar33 = pMVar32->elemsize;
    iVar3 = pMVar32->elempack;
    lVar13 = ((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                    _M_impl.super__Vector_impl_data._M_finish - (long)pMVar32) / 0x48;
    piVar16 = &pMVar32->d;
    iVar28 = 0;
    while (bVar40 = lVar13 != 0, lVar13 = lVar13 + -1, bVar40) {
      iVar28 = iVar28 + *piVar16;
      piVar16 = piVar16 + 0x12;
    }
    pMVar6 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    Mat::create(pMVar6,pMVar32->w,pMVar32->h,iVar28,uVar2,sVar33,iVar3,opt->blob_allocator);
    if (pMVar6->data != (void *)0x0) {
      if ((long)pMVar6->c * pMVar6->cstep != 0) {
        uVar38 = (ulong)uVar2;
        if ((int)uVar2 < 1) {
          uVar38 = 0;
        }
        for (uVar14 = 0; uVar14 != uVar38; uVar14 = uVar14 + 1) {
          pvVar37 = (void *)(pMVar6->cstep * uVar14 * pMVar6->elemsize + (long)pMVar6->data);
          lVar13 = 0x40;
          for (uVar26 = 0;
              pMVar32 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                        _M_impl.super__Vector_impl_data._M_start,
              uVar26 < (ulong)(((long)(bottom_blobs->
                                      super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                      _M_impl.super__Vector_impl_data._M_finish - (long)pMVar32) /
                              0x48); uVar26 = uVar26 + 1) {
            lVar29 = (long)*(int *)((long)pMVar32 + lVar13 + -0xc) *
                     (long)*(int *)((long)pMVar32 + lVar13 + -0x10) *
                     (long)*(int *)((long)pMVar32 + lVar13 + -0x14);
            memcpy(pvVar37,(void *)(*(long *)((long)&pMVar32->data + lVar13) * uVar14 *
                                    *(long *)((long)pMVar32 + lVar13 + -0x30) +
                                   *(long *)((long)pMVar32 + lVar13 + -0x40)),lVar29 * sVar33);
            pvVar37 = (void *)((long)pvVar37 + (long)((int)lVar29 * iVar3) * 4);
            lVar13 = lVar13 + 0x48;
          }
        }
        return 0;
      }
      return -100;
    }
  }
  return -100;
}

Assistant:

int Concat_x86::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    int dims = bottom_blobs[0].dims;
    int positive_axis = axis < 0 ? dims + axis : axis;

    if (dims == 1) // positive_axis == 0
    {
        // concat vector
        // total length
        size_t elemsize = bottom_blobs[0].elemsize;
        int elempack = bottom_blobs[0].elempack;
        int top_w = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_w += bottom_blob.w * bottom_blob.elempack;
        }

        int out_elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
#if __AVX512F__
            out_elempack = top_w % 16 == 0 ? 16 : top_w % 8 == 0 ? 8 : top_w % 4 == 0 ? 4 : 1;
#elif __AVX__
            out_elempack = top_w % 8 == 0 ? 8 : top_w % 4 == 0 ? 4 : 1;
#else
            out_elempack = top_w % 4 == 0 ? 4 : 1;
#endif
        }
#endif // __SSE2__
        size_t out_elemsize = elemsize / elempack * out_elempack;

        Mat& top_blob = top_blobs[0];
        top_blob.create(top_w / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        float* outptr = top_blob;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];

            const float* ptr = bottom_blob;
            memcpy(outptr, ptr, bottom_blob.w * bottom_blob.elemsize);

            outptr += bottom_blob.w * bottom_blob.elempack;
        }
    }

    if (dims == 2 && positive_axis == 0)
    {
        // concat image
        int w = bottom_blobs[0].w;

        // total height
        size_t elemsize = bottom_blobs[0].elemsize;
        int elempack = bottom_blobs[0].elempack;
        int top_h = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            elemsize = std::min(elemsize, bottom_blob.elemsize);
            elempack = std::min(elempack, bottom_blob.elempack);
            top_h += bottom_blob.h * bottom_blob.elempack;
        }

        int out_elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
#if __AVX512F__
            out_elempack = top_h % 16 == 0 ? 16 : top_h % 8 == 0 ? 8 : top_h % 4 == 0 ? 4 : 1;
#elif __AVX__
            out_elempack = top_h % 8 == 0 ? 8 : top_h % 4 == 0 ? 4 : 1;
#else
            out_elempack = top_h % 4 == 0 ? 4 : 1;
#endif
        }
#endif // __SSE2__
        size_t out_elemsize = elemsize / elempack * out_elempack;

        Mat& top_blob = top_blobs[0];
        top_blob.create(w, top_h / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        Mat top_blob_unpacked = top_blob;
        if (elempack < out_elempack)
        {
            top_blob_unpacked.create(w, top_h / elempack, elemsize, elempack, opt.workspace_allocator);
            if (top_blob_unpacked.empty())
                return -100;
        }

        float* outptr = top_blob_unpacked;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];

#if __AVX__
#if __AVX512F__
            if (bottom_blob.elempack == 16 && elempack == 8)
            {
                for (int i = 0; i < bottom_blob.h; i++)
                {
                    const float* r0 = bottom_blob.row(i);

                    float* outptr0 = outptr;
                    float* outptr1 = outptr + w * 8;

                    for (int j = 0; j < w; j++)
                    {
                        outptr0[0] = r0[0];
                        outptr0[1] = r0[1];
                        outptr0[2] = r0[2];
                        outptr0[3] = r0[3];
                        outptr0[4] = r0[4];
                        outptr0[5] = r0[5];
                        outptr0[6] = r0[6];
                        outptr0[7] = r0[7];
                        outptr1[0] = r0[8];
                        outptr1[1] = r0[9];
                        outptr1[2] = r0[10];
                        outptr1[3] = r0[11];
                        outptr1[4] = r0[12];
                        outptr1[5] = r0[13];
                        outptr1[6] = r0[14];
                        outptr1[7] = r0[15];

                        outptr0 += 8;
                        outptr1 += 8;
                        r0 += 16;
                    }

                    outptr += w * 16;
                }
            }
            if (bottom_blob.elempack == 16 && elempack == 4)
            {
                for (int i = 0; i < bottom_blob.h; i++)
                {
                    const float* r0 = bottom_blob.row(i);

                    float* outptr0 = outptr;
                    float* outptr1 = outptr + w * 4;
                    float* outptr2 = outptr + w * 8;
                    float* outptr3 = outptr + w * 12;

                    for (int j = 0; j < w; j++)
                    {
                        outptr0[0] = r0[0];
                        outptr0[1] = r0[1];
                        outptr0[2] = r0[2];
                        outptr0[3] = r0[3];
                        outptr1[0] = r0[4];
                        outptr1[1] = r0[5];
                        outptr1[2] = r0[6];
                        outptr1[3] = r0[7];
                        outptr2[0] = r0[8];
                        outptr2[1] = r0[9];
                        outptr2[2] = r0[10];
                        outptr2[3] = r0[11];
                        outptr3[0] = r0[12];
                        outptr3[1] = r0[13];
                        outptr3[2] = r0[14];
                        outptr3[3] = r0[15];

                        outptr0 += 4;
                        outptr1 += 4;
                        outptr2 += 4;
                        outptr3 += 4;
                        r0 += 16;
                    }

                    outptr += w * 16;
                }
            }
            if (bottom_blob.elempack == 16 && elempack == 1)
            {
                for (int i = 0; i < bottom_blob.h; i++)
                {
                    const float* r0 = bottom_blob.row(i);

                    float* outptr0 = outptr;
                    float* outptr1 = outptr + w;
                    float* outptr2 = outptr + w * 2;
                    float* outptr3 = outptr + w * 3;
                    float* outptr4 = outptr + w * 4;
                    float* outptr5 = outptr + w * 5;
                    float* outptr6 = outptr + w * 6;
                    float* outptr7 = outptr + w * 7;
                    float* outptr8 = outptr + w * 8;
                    float* outptr9 = outptr + w * 9;
                    float* outptra = outptr + w * 10;
                    float* outptrb = outptr + w * 11;
                    float* outptrc = outptr + w * 12;
                    float* outptrd = outptr + w * 13;
                    float* outptre = outptr + w * 14;
                    float* outptrf = outptr + w * 15;

                    for (int j = 0; j < w; j++)
                    {
                        *outptr0++ = r0[0];
                        *outptr1++ = r0[1];
                        *outptr2++ = r0[2];
                        *outptr3++ = r0[3];
                        *outptr4++ = r0[4];
                        *outptr5++ = r0[5];
                        *outptr6++ = r0[6];
                        *outptr7++ = r0[7];
                        *outptr8++ = r0[8];
                        *outptr9++ = r0[9];
                        *outptra++ = r0[10];
                        *outptrb++ = r0[11];
                        *outptrc++ = r0[12];
                        *outptrd++ = r0[13];
                        *outptre++ = r0[14];
                        *outptrf++ = r0[15];

                        r0 += 16;
                    }

                    outptr += w * 16;
                }
            }
#endif // __AVX512F__
            if (bottom_blob.elempack == 8 && elempack == 4)
            {
                for (int i = 0; i < bottom_blob.h; i++)
                {
                    const float* r0 = bottom_blob.row(i);

                    float* outptr0 = outptr;
                    float* outptr1 = outptr + w * 4;

                    for (int j = 0; j < w; j++)
                    {
                        outptr0[0] = r0[0];
                        outptr0[1] = r0[1];
                        outptr0[2] = r0[2];
                        outptr0[3] = r0[3];
                        outptr1[0] = r0[4];
                        outptr1[1] = r0[5];
                        outptr1[2] = r0[6];
                        outptr1[3] = r0[7];

                        outptr0 += 4;
                        outptr1 += 4;
                        r0 += 8;
                    }

                    outptr += w * 8;
                }
            }
            if (bottom_blob.elempack == 8 && elempack == 1)
            {
                for (int i = 0; i < bottom_blob.h; i++)
                {
                    const float* r0 = bottom_blob.row(i);

                    float* outptr0 = outptr;
                    float* outptr1 = outptr + w;
                    float* outptr2 = outptr + w * 2;
                    float* outptr3 = outptr + w * 3;
                    float* outptr4 = outptr + w * 4;
                    float* outptr5 = outptr + w * 5;
                    float* outptr6 = outptr + w * 6;
                    float* outptr7 = outptr + w * 7;

                    for (int j = 0; j < w; j++)
                    {
                        *outptr0++ = r0[0];
                        *outptr1++ = r0[1];
                        *outptr2++ = r0[2];
                        *outptr3++ = r0[3];
                        *outptr4++ = r0[4];
                        *outptr5++ = r0[5];
                        *outptr6++ = r0[6];
                        *outptr7++ = r0[7];

                        r0 += 8;
                    }

                    outptr += w * 8;
                }
            }
#endif // __AVX__
            if (bottom_blob.elempack == 4 && elempack == 1)
            {
                for (int i = 0; i < bottom_blob.h; i++)
                {
                    const float* r0 = bottom_blob.row(i);

                    float* outptr0 = outptr;
                    float* outptr1 = outptr + w;
                    float* outptr2 = outptr + w * 2;
                    float* outptr3 = outptr + w * 3;

                    for (int j = 0; j < w; j++)
                    {
                        *outptr0++ = r0[0];
                        *outptr1++ = r0[1];
                        *outptr2++ = r0[2];
                        *outptr3++ = r0[3];

                        r0 += 4;
                    }

                    outptr += w * 4;
                }
            }
            if (bottom_blob.elempack == elempack) // 1-1 4-4 8-8 16-16
            {
                int size = w * bottom_blob.h;

                const float* ptr = bottom_blob;
                memcpy(outptr, ptr, size * bottom_blob.elemsize);

                outptr += size * bottom_blob.elempack;
            }
        }

        // packing
        if (elempack < out_elempack)
        {
            convert_packing(top_blob_unpacked, top_blob, out_elempack, opt);
        }
    }

    if (dims == 2 && positive_axis == 1)
    {
        // interleave image row
        int h = bottom_blobs[0].h;
        size_t elemsize = bottom_blobs[0].elemsize;
        int elempack = bottom_blobs[0].elempack;

        // total width
        int top_w = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_w += bottom_blob.w;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(top_w, h, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; i++)
        {
            float* outptr = top_blob.row(i);
            for (size_t b = 0; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob = bottom_blobs[b];

                const float* ptr = bottom_blob.row(i);
                memcpy(outptr, ptr, bottom_blob.w * elemsize);

                outptr += bottom_blob.w * elempack;
            }
        }
    }

    if ((dims == 3 || dims == 4) && positive_axis == 0)
    {
        // concat dim
        int w = bottom_blobs[0].w;
        int h = bottom_blobs[0].h;
        int d = bottom_blobs[0].d;

        // total channels
        size_t elemsize = bottom_blobs[0].elemsize;
        int elempack = bottom_blobs[0].elempack;
        int top_channels = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            elemsize = std::min(elemsize, bottom_blob.elemsize);
            elempack = std::min(elempack, bottom_blob.elempack);
            top_channels += bottom_blob.c * bottom_blob.elempack;
        }

        int out_elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
#if __AVX512F__
            out_elempack = top_channels % 16 == 0 ? 16 : top_channels % 8 == 0 ? 8 : top_channels % 4 == 0 ? 4 : 1;
#elif __AVX__
            out_elempack = top_channels % 8 == 0 ? 8 : top_channels % 4 == 0 ? 4 : 1;
#else
            out_elempack = top_channels % 4 == 0 ? 4 : 1;
#endif
        }
#endif // __SSE2__
        size_t out_elemsize = elemsize / elempack * out_elempack;

        Mat& top_blob = top_blobs[0];
        top_blob.create(w, h, d, top_channels / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        top_blob.dims = dims;

        Mat top_blob_unpacked = top_blob;
        if (elempack < out_elempack)
        {
            top_blob_unpacked.create(w, h, d, top_channels / elempack, elemsize, elempack, opt.workspace_allocator);
            if (top_blob_unpacked.empty())
                return -100;

            top_blob_unpacked.dims = dims;
        }

        int p = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];

#if __AVX__
#if __AVX512F__
            if (bottom_blob.elempack == 16 && elempack == 8)
            {
                int size = bottom_blob.w * bottom_blob.h * bottom_blob.d;

                for (int q = 0; q < bottom_blob.c; q++)
                {
                    const float* r0 = bottom_blob.channel(q);

                    float* outptr0 = top_blob_unpacked.channel(p);
                    float* outptr1 = top_blob_unpacked.channel(p + 1);

                    for (int i = 0; i < size; i++)
                    {
                        outptr0[0] = r0[0];
                        outptr0[1] = r0[1];
                        outptr0[2] = r0[2];
                        outptr0[3] = r0[3];
                        outptr0[4] = r0[4];
                        outptr0[5] = r0[5];
                        outptr0[6] = r0[6];
                        outptr0[7] = r0[7];
                        outptr1[0] = r0[8];
                        outptr1[1] = r0[9];
                        outptr1[2] = r0[10];
                        outptr1[3] = r0[11];
                        outptr1[4] = r0[12];
                        outptr1[5] = r0[13];
                        outptr1[6] = r0[14];
                        outptr1[7] = r0[15];

                        outptr0 += 8;
                        outptr1 += 8;
                        r0 += 16;
                    }

                    p += 2;
                }
            }
            if (bottom_blob.elempack == 16 && elempack == 4)
            {
                int size = bottom_blob.w * bottom_blob.h * bottom_blob.d;

                for (int q = 0; q < bottom_blob.c; q++)
                {
                    const float* r0 = bottom_blob.channel(q);

                    float* outptr0 = top_blob_unpacked.channel(p);
                    float* outptr1 = top_blob_unpacked.channel(p + 1);
                    float* outptr2 = top_blob_unpacked.channel(p + 2);
                    float* outptr3 = top_blob_unpacked.channel(p + 3);

                    for (int i = 0; i < size; i++)
                    {
                        outptr0[0] = r0[0];
                        outptr0[1] = r0[1];
                        outptr0[2] = r0[2];
                        outptr0[3] = r0[3];
                        outptr1[0] = r0[4];
                        outptr1[1] = r0[5];
                        outptr1[2] = r0[6];
                        outptr1[3] = r0[7];
                        outptr2[0] = r0[8];
                        outptr2[1] = r0[9];
                        outptr2[2] = r0[10];
                        outptr2[3] = r0[11];
                        outptr3[0] = r0[12];
                        outptr3[1] = r0[13];
                        outptr3[2] = r0[14];
                        outptr3[3] = r0[15];

                        outptr0 += 4;
                        outptr1 += 4;
                        outptr2 += 4;
                        outptr3 += 4;
                        r0 += 16;
                    }

                    p += 4;
                }
            }
            if (bottom_blob.elempack == 16 && elempack == 1)
            {
                int size = bottom_blob.w * bottom_blob.h * bottom_blob.d;

                for (int q = 0; q < bottom_blob.c; q++)
                {
                    const float* r0 = bottom_blob.channel(q);

                    float* outptr0 = top_blob_unpacked.channel(p);
                    float* outptr1 = top_blob_unpacked.channel(p + 1);
                    float* outptr2 = top_blob_unpacked.channel(p + 2);
                    float* outptr3 = top_blob_unpacked.channel(p + 3);
                    float* outptr4 = top_blob_unpacked.channel(p + 4);
                    float* outptr5 = top_blob_unpacked.channel(p + 5);
                    float* outptr6 = top_blob_unpacked.channel(p + 6);
                    float* outptr7 = top_blob_unpacked.channel(p + 7);
                    float* outptr8 = top_blob_unpacked.channel(p + 8);
                    float* outptr9 = top_blob_unpacked.channel(p + 9);
                    float* outptra = top_blob_unpacked.channel(p + 10);
                    float* outptrb = top_blob_unpacked.channel(p + 11);
                    float* outptrc = top_blob_unpacked.channel(p + 12);
                    float* outptrd = top_blob_unpacked.channel(p + 13);
                    float* outptre = top_blob_unpacked.channel(p + 14);
                    float* outptrf = top_blob_unpacked.channel(p + 15);

                    for (int i = 0; i < size; i++)
                    {
                        *outptr0++ = r0[0];
                        *outptr1++ = r0[1];
                        *outptr2++ = r0[2];
                        *outptr3++ = r0[3];
                        *outptr4++ = r0[4];
                        *outptr5++ = r0[5];
                        *outptr6++ = r0[6];
                        *outptr7++ = r0[7];
                        *outptr8++ = r0[8];
                        *outptr9++ = r0[9];
                        *outptra++ = r0[10];
                        *outptrb++ = r0[11];
                        *outptrc++ = r0[12];
                        *outptrd++ = r0[13];
                        *outptre++ = r0[14];
                        *outptrf++ = r0[15];

                        r0 += 16;
                    }

                    p += 16;
                }
            }
#endif // __AVX512F__
            if (bottom_blob.elempack == 8 && elempack == 4)
            {
                int size = bottom_blob.w * bottom_blob.h * bottom_blob.d;

                for (int q = 0; q < bottom_blob.c; q++)
                {
                    const float* r0 = bottom_blob.channel(q);

                    float* outptr0 = top_blob_unpacked.channel(p);
                    float* outptr1 = top_blob_unpacked.channel(p + 1);

                    for (int i = 0; i < size; i++)
                    {
                        outptr0[0] = r0[0];
                        outptr0[1] = r0[1];
                        outptr0[2] = r0[2];
                        outptr0[3] = r0[3];
                        outptr1[0] = r0[4];
                        outptr1[1] = r0[5];
                        outptr1[2] = r0[6];
                        outptr1[3] = r0[7];

                        outptr0 += 4;
                        outptr1 += 4;
                        r0 += 8;
                    }

                    p += 2;
                }
            }
            if (bottom_blob.elempack == 8 && elempack == 1)
            {
                int size = bottom_blob.w * bottom_blob.h * bottom_blob.d;

                for (int q = 0; q < bottom_blob.c; q++)
                {
                    const float* r0 = bottom_blob.channel(q);

                    float* outptr0 = top_blob_unpacked.channel(p);
                    float* outptr1 = top_blob_unpacked.channel(p + 1);
                    float* outptr2 = top_blob_unpacked.channel(p + 2);
                    float* outptr3 = top_blob_unpacked.channel(p + 3);
                    float* outptr4 = top_blob_unpacked.channel(p + 4);
                    float* outptr5 = top_blob_unpacked.channel(p + 5);
                    float* outptr6 = top_blob_unpacked.channel(p + 6);
                    float* outptr7 = top_blob_unpacked.channel(p + 7);

                    for (int i = 0; i < size; i++)
                    {
                        *outptr0++ = r0[0];
                        *outptr1++ = r0[1];
                        *outptr2++ = r0[2];
                        *outptr3++ = r0[3];
                        *outptr4++ = r0[4];
                        *outptr5++ = r0[5];
                        *outptr6++ = r0[6];
                        *outptr7++ = r0[7];

                        r0 += 8;
                    }

                    p += 8;
                }
            }
#endif // __AVX__
            if (bottom_blob.elempack == 4 && elempack == 1)
            {
                int size = bottom_blob.w * bottom_blob.h * bottom_blob.d;

                for (int q = 0; q < bottom_blob.c; q++)
                {
                    const float* r0 = bottom_blob.channel(q);

                    float* outptr0 = top_blob_unpacked.channel(p);
                    float* outptr1 = top_blob_unpacked.channel(p + 1);
                    float* outptr2 = top_blob_unpacked.channel(p + 2);
                    float* outptr3 = top_blob_unpacked.channel(p + 3);

                    for (int i = 0; i < size; i++)
                    {
                        *outptr0++ = r0[0];
                        *outptr1++ = r0[1];
                        *outptr2++ = r0[2];
                        *outptr3++ = r0[3];

                        r0 += 4;
                    }

                    p += 4;
                }
            }
            if (bottom_blob.elempack == elempack) // 1-1 4-4 8-8
            {
                int size = bottom_blob.total();

                const float* ptr = bottom_blob;
                float* outptr = top_blob_unpacked.channel(p);
                memcpy(outptr, ptr, size * bottom_blob.elemsize);

                p += bottom_blob.c;
            }
        }

        // packing
        if (elempack < out_elempack)
        {
            convert_packing(top_blob_unpacked, top_blob, out_elempack, opt);
        }
    }

    if ((dims == 3 && positive_axis == 1) || (dims == 4 && positive_axis == 2))
    {
        // interleave dim height
        int w = bottom_blobs[0].w;
        int d = bottom_blobs[0].d;
        int channels = bottom_blobs[0].c;
        size_t elemsize = bottom_blobs[0].elemsize;
        int elempack = bottom_blobs[0].elempack;

        // total height
        int top_h = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_h += bottom_blob.h;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(w, top_h, d, channels, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        top_blob.dims = dims;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < d; i++)
            {
                for (size_t b = 0; b < bottom_blobs.size(); b++)
                {
                    const Mat& bottom_blob = bottom_blobs[b];

                    int size = bottom_blob.w * bottom_blob.h;

                    const float* ptr = bottom_blob.channel(q).depth(i);
                    memcpy(outptr, ptr, size * elemsize);

                    outptr += size * elempack;
                }
            }
        }
    }

    if ((dims == 3 && positive_axis == 2) || (dims == 4 && positive_axis == 3))
    {
        // interleave dim width
        int h = bottom_blobs[0].h;
        int d = bottom_blobs[0].d;
        int channels = bottom_blobs[0].c;
        size_t elemsize = bottom_blobs[0].elemsize;
        int elempack = bottom_blobs[0].elempack;

        // total height
        int top_w = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_w += bottom_blob.w;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(top_w, h, d, channels, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        top_blob.dims = dims;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < d; i++)
            {
                for (int j = 0; j < h; j++)
                {
                    for (size_t b = 0; b < bottom_blobs.size(); b++)
                    {
                        const Mat& bottom_blob = bottom_blobs[b];

                        const float* ptr = bottom_blob.channel(q).depth(i).row(j);
                        memcpy(outptr, ptr, bottom_blob.w * elemsize);

                        outptr += bottom_blob.w * elempack;
                    }
                }
            }
        }
    }

    if (dims == 4 && positive_axis == 1)
    {
        // interleave dim depth
        int w = bottom_blobs[0].w;
        int h = bottom_blobs[0].h;
        int channels = bottom_blobs[0].c;
        size_t elemsize = bottom_blobs[0].elemsize;
        int elempack = bottom_blobs[0].elempack;

        // total depth
        int top_d = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_d += bottom_blob.d;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(w, h, top_d, channels, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* outptr = top_blob.channel(q);

            for (size_t b = 0; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob = bottom_blobs[b];

                int size = bottom_blob.w * bottom_blob.h * bottom_blob.d;

                const float* ptr = bottom_blob.channel(q);
                memcpy(outptr, ptr, size * elemsize);

                outptr += size * elempack;
            }
        }
    }

    return 0;
}